

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     BinaryScatter<duckdb::ArgMinMaxState<duckdb::string_t,int>,duckdb::string_t,int,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (AggregateInputData *aggr_input_data,Vector *a,Vector *b,Vector *states,idx_t count)

{
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  UnifiedVectorFormat *in_stack_fffffffffffffec0;
  UnifiedVectorFormat *local_120;
  SelectionVector *in_stack_fffffffffffffee8;
  idx_t in_stack_fffffffffffffef0;
  ArgMinMaxState<duckdb::string_t,_int> **in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  AggregateInputData *in_stack_ffffffffffffff08;
  string_t *in_stack_ffffffffffffff10;
  SelectionVector *in_stack_ffffffffffffff20;
  SelectionVector *in_stack_ffffffffffffff28;
  ValidityMask *in_stack_ffffffffffffff30;
  SelectionVector *in_stack_ffffffffffffff38;
  UnifiedVectorFormat *in_stack_ffffffffffffff70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff78;
  Vector *in_stack_ffffffffffffff80;
  
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffec0);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffec0);
  UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffec0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78._M_pi,
             in_stack_ffffffffffffff70);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78._M_pi,
             in_stack_ffffffffffffff70);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78._M_pi,
             in_stack_ffffffffffffff70);
  UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)&stack0xffffffffffffff80);
  UnifiedVectorFormat::GetData<int>((UnifiedVectorFormat *)&stack0xffffffffffffff38);
  BinaryScatterLoop<duckdb::ArgMinMaxState<duckdb::string_t,int>,duckdb::string_t,int,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_ffffffffffffff30,
             (ValidityMask *)in_stack_ffffffffffffff38);
  UnifiedVectorFormat::~UnifiedVectorFormat(local_120);
  UnifiedVectorFormat::~UnifiedVectorFormat(local_120);
  UnifiedVectorFormat::~UnifiedVectorFormat(local_120);
  return;
}

Assistant:

static void BinaryScatter(AggregateInputData &aggr_input_data, Vector &a, Vector &b, Vector &states, idx_t count) {
		UnifiedVectorFormat adata, bdata, sdata;

		a.ToUnifiedFormat(count, adata);
		b.ToUnifiedFormat(count, bdata);
		states.ToUnifiedFormat(count, sdata);

		BinaryScatterLoop<STATE_TYPE, A_TYPE, B_TYPE, OP>(
		    UnifiedVectorFormat::GetData<A_TYPE>(adata), aggr_input_data, UnifiedVectorFormat::GetData<B_TYPE>(bdata),
		    (STATE_TYPE **)sdata.data, count, *adata.sel, *bdata.sel, *sdata.sel, adata.validity, bdata.validity);
	}